

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::ListValue::Clear(ListValue *this)

{
  uint32_t cached_has_bits;
  ListValue *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Value>::Clear(&this->values_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ListValue::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.ListValue)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  values_.Clear();
  _internal_metadata_.Clear<std::string>();
}